

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O1

bool __thiscall Debugger::SourceRunDown(Debugger *this)

{
  bool bVar1;
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsValueRef local_40;
  JsValueRef result;
  JsValueRef sourcesList;
  AutoRestoreContext autoRestoreContext;
  
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&sourcesList,this->m_context);
  result = (JsValueRef)0x0;
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetScripts)(&result);
  if (jsErrorCode == JsNoError) {
    local_40 = (JsValueRef)0x0;
    bVar1 = CallFunction(this,"HandleSourceRunDown",&local_40,result,(JsValueRef)0x0);
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    PAL_fwprintf(pPVar2,
                 L"ERROR: ChakraRTInterface::JsDiagGetScripts(&sourcesList) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    bVar1 = false;
  }
  if (((char)autoRestoreContext.oldContext == '\x01') && (sourcesList != (JsValueRef)0x0)) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(sourcesList);
  }
  return bVar1;
}

Assistant:

bool Debugger::SourceRunDown()
{
    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef sourcesList = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsDiagGetScripts(&sourcesList));

    return this->CallFunctionNoResult("HandleSourceRunDown", sourcesList);
}